

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O3

void __thiscall wallet::wallet_tests::importwallet_rescan::test_method(importwallet_rescan *this)

{
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *val;
  CKey *this_00;
  _Alloc_hider _Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  long lVar4;
  pointer ppCVar5;
  pointer ppCVar6;
  uint256 *puVar7;
  MockableData records;
  MockableData records_00;
  UniValue val_00;
  UniValue val_01;
  base_blob<256U> *pbVar8;
  element_type *peVar9;
  Chainstate *pCVar10;
  LegacyScriptPubKeyMan *pLVar11;
  mapped_type *pmVar12;
  pointer psVar13;
  CWalletTx *pCVar14;
  ulong uVar15;
  char *pcVar16;
  iterator pvVar17;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *__args_2;
  iterator pvVar18;
  long lVar19;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *this_01;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  undefined8 in_stack_fffffffffffff9f8;
  TestChain100Setup *pTVar20;
  TestChain100Setup *pTVar21;
  undefined8 in_stack_fffffffffffffa08;
  ArgsManager *this_02;
  undefined8 in_stack_fffffffffffffa10;
  undefined8 in_stack_fffffffffffffa18;
  size_t in_stack_fffffffffffffa20;
  undefined8 in_stack_fffffffffffffa28;
  undefined8 in_stack_fffffffffffffa30;
  undefined8 in_stack_fffffffffffffa38;
  undefined8 in_stack_fffffffffffffa40;
  pointer in_stack_fffffffffffffa48;
  bool expected;
  bool found;
  undefined7 uStack_5a7;
  undefined1 *local_5a0;
  undefined1 *local_598;
  char *local_590;
  char *local_588;
  shared_ptr<wallet::CWallet> wallet_1;
  shared_ptr<wallet::CWallet> wallet;
  bool *local_548;
  char *local_540;
  char *local_538;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock36;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock35;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  shared_count sStack_4e0;
  UniValue local_4d8;
  UniValue local_480;
  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  local_428;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock34;
  undefined1 *local_3e8 [2];
  undefined1 local_3d8 [32];
  _Alloc_hider local_3b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  vector<RPCArg,_std::allocator<RPCArg>_> local_398;
  vector<RPCResult,_std::allocator<RPCResult>_> local_380;
  _Alloc_hider local_368;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_358 [2];
  UniValue local_338;
  UniValue local_2e0;
  JSONRPCRequest request;
  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  local_128;
  WalletContext context;
  path local_80;
  string backup_file;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  val = &(this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
         super_BasicTestingSetup.m_node.chainman;
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            (val,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x10b,"test_method","m_node.chainman");
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            (val,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x10b,"operator()","m_node.chainman");
  request.id.super__Optional_base<UniValue,_false,_false>._M_payload.
  super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
  _M_payload._0_8_ = &cs_main;
  request.id.super__Optional_base<UniValue,_false,_false>._M_payload.
  super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
  _M_payload._M_value.val._M_dataplus._M_p =
       (_Alloc_hider)
       ((ulong)request.id.super__Optional_base<UniValue,_false,_false>._M_payload.
               super__Optional_payload<UniValue,_true,_false,_false>.
               super__Optional_payload_base<UniValue>._M_payload._M_value.val._M_dataplus._M_p &
       0xffffffffffffff00);
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&request);
  pCVar10 = ChainstateManager::ActiveChainstate
                      ((val->_M_t).
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  uVar15 = (ulong)(pCVar10->m_chain).vChain.
                  super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1]->nTimeMax;
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&request);
  SetMockTime(uVar15 + 5);
  wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = &(this->super_TestChain100Setup).coinbaseKey;
  CKey::GetPubKey((CPubKey *)&criticalblock34,this_00);
  GetScriptForRawPubKey((CScript *)&context,(CPubKey *)&criticalblock34);
  TestChain100Setup::CreateAndProcessBlock
            ((CBlock *)&request,&this->super_TestChain100Setup,
             (vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)&wallet,
             (CScript *)&context,(Chainstate *)0x0);
  this_01 = &(this->super_TestChain100Setup).m_coinbase_txns;
  std::
  vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>::
  emplace_back<std::shared_ptr<CTransaction_const>&>
            ((vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
              *)this_01,
             (shared_ptr<const_CTransaction> *)
             request.id.super__Optional_base<UniValue,_false,_false>._M_payload.
             super__Optional_payload<UniValue,_true,_false,_false>.
             super__Optional_payload_base<UniValue>._M_payload._M_value.values.
             super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
             ._M_end_of_storage);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&request.id.super__Optional_base<UniValue,_false,_false>._M_payload.
                super__Optional_payload<UniValue,_true,_false,_false>.
                super__Optional_payload_base<UniValue>._M_payload._M_value.values.
                super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  if (0x1c < context.wallets_mutex.super_mutex.super___mutex_base._M_mutex.__data.__count) {
    free(context.chain);
  }
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::~vector
            ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)&wallet);
  wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  CKey::GetPubKey((CPubKey *)&criticalblock34,this_00);
  GetScriptForRawPubKey((CScript *)&context,(CPubKey *)&criticalblock34);
  TestChain100Setup::CreateAndProcessBlock
            ((CBlock *)&request,&this->super_TestChain100Setup,
             (vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)&wallet,
             (CScript *)&context,(Chainstate *)0x0);
  std::
  vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>::
  emplace_back<std::shared_ptr<CTransaction_const>&>
            ((vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
              *)this_01,
             (shared_ptr<const_CTransaction> *)
             request.id.super__Optional_base<UniValue,_false,_false>._M_payload.
             super__Optional_payload<UniValue,_true,_false,_false>.
             super__Optional_payload_base<UniValue>._M_payload._M_value.values.
             super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
             ._M_end_of_storage);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&request.id.super__Optional_base<UniValue,_false,_false>._M_payload.
                super__Optional_payload<UniValue,_true,_false,_false>.
                super__Optional_payload_base<UniValue>._M_payload._M_value.values.
                super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  if (0x1c < context.wallets_mutex.super_mutex.super___mutex_base._M_mutex.__data.__count) {
    free(context.chain);
  }
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::~vector
            ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)&wallet);
  lVar19 = uVar15 + 0x1c25;
  SetMockTime(lVar19);
  wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  CKey::GetPubKey((CPubKey *)&criticalblock34,this_00);
  GetScriptForRawPubKey((CScript *)&context,(CPubKey *)&criticalblock34);
  TestChain100Setup::CreateAndProcessBlock
            ((CBlock *)&request,&this->super_TestChain100Setup,
             (vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)&wallet,
             (CScript *)&context,(Chainstate *)0x0);
  std::
  vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>::
  emplace_back<std::shared_ptr<CTransaction_const>&>
            ((vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
              *)this_01,
             (shared_ptr<const_CTransaction> *)
             request.id.super__Optional_base<UniValue,_false,_false>._M_payload.
             super__Optional_payload<UniValue,_true,_false,_false>.
             super__Optional_payload_base<UniValue>._M_payload._M_value.values.
             super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
             ._M_end_of_storage);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&request.id.super__Optional_base<UniValue,_false,_false>._M_payload.
                super__Optional_payload<UniValue,_true,_false,_false>.
                super__Optional_payload_base<UniValue>._M_payload._M_value.values.
                super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  pTVar20 = &this->super_TestChain100Setup;
  if (0x1c < context.wallets_mutex.super_mutex.super___mutex_base._M_mutex.__data.__count) {
    free(context.chain);
  }
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::~vector
            ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)&wallet);
  this_02 = &(this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
             super_BasicTestingSetup.m_args;
  ArgsManager::GetDataDir((path *)&local_80,this_02,true);
  std::filesystem::__cxx11::path::_M_append(&local_80,0xd,"wallet.backup");
  std::filesystem::__cxx11::path::path((path *)&request,&local_80);
  backup_file._M_dataplus._M_p = (pointer)&backup_file.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&backup_file,
             request.id.super__Optional_base<UniValue,_false,_false>._M_payload.
             super__Optional_payload<UniValue,_true,_false,_false>.
             super__Optional_payload_base<UniValue>._M_payload._0_8_,
             (long)request.id.super__Optional_base<UniValue,_false,_false>._M_payload.
                   super__Optional_payload<UniValue,_true,_false,_false>.
                   super__Optional_payload_base<UniValue>._M_payload._M_value.val._M_dataplus._M_p +
             request.id.super__Optional_base<UniValue,_false,_false>._M_payload.
             super__Optional_payload<UniValue,_true,_false,_false>.
             super__Optional_payload_base<UniValue>._M_payload._0_8_);
  std::filesystem::__cxx11::path::~path((path *)&request);
  std::filesystem::__cxx11::path::~path(&local_80);
  WalletContext::WalletContext(&context);
  request.id.super__Optional_base<UniValue,_false,_false>._M_payload.
  super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
  _M_payload._0_8_ =
       (this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
       super_BasicTestingSetup.m_node.chain._M_t.
       super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
       super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
       super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
  local_128._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_128._M_impl.super__Rb_tree_header._M_header;
  local_128._M_impl._0_8_ = 0;
  local_128._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_128._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_128._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_128._M_impl.super__Rb_tree_header._M_node_count = 0;
  records._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = pTVar20;
  records._M_t._M_impl._0_8_ = in_stack_fffffffffffff9f8;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)in_stack_fffffffffffffa08;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)in_stack_fffffffffffffa10;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)in_stack_fffffffffffffa18;
  records._M_t._M_impl.super__Rb_tree_header._M_node_count = in_stack_fffffffffffffa20;
  local_128._M_impl.super__Rb_tree_header._M_header._M_right =
       local_128._M_impl.super__Rb_tree_header._M_header._M_left;
  context.args = this_02;
  CreateMockableWalletDatabase((wallet *)&criticalblock34,records);
  wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<wallet::CWallet,std::allocator<wallet::CWallet>,interfaces::Chain*,char_const(&)[1],std::unique_ptr<wallet::WalletDatabase,std::default_delete<wallet::WalletDatabase>>>
            (&wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (CWallet **)&wallet,(allocator<wallet::CWallet> *)&criticalblock1,(Chain **)&request,
             (char (*) [1])0xf73bdc,
             (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *)
             &criticalblock34);
  if (criticalblock34.super_unique_lock._M_device != (mutex_type *)0x0) {
    (**(code **)(((criticalblock34.super_unique_lock._M_device)->super___recursive_mutex_base).
                 _M_mutex.__align + 8))();
  }
  criticalblock34.super_unique_lock._M_device = (mutex_type *)0x0;
  std::
  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::~_Rb_tree(&local_128);
  pLVar11 = CWallet::GetOrCreateLegacyScriptPubKeyMan
                      (wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      );
  criticalblock1.super_unique_lock._M_device =
       &((wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->cs_wallet)
        .super_recursive_mutex;
  criticalblock1.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock1.super_unique_lock);
  criticalblock2.super_unique_lock._M_device =
       &(pLVar11->super_LegacyDataSPKM).super_FillableSigningProvider.cs_KeyStore.
        super_recursive_mutex;
  criticalblock2.super_unique_lock._8_8_ =
       criticalblock2.super_unique_lock._8_8_ & 0xffffffffffffff00;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock2.super_unique_lock);
  CKey::GetPubKey((CPubKey *)&request,this_00);
  CPubKey::GetID((CKeyID *)&criticalblock34,(CPubKey *)&request);
  pmVar12 = std::
            map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
            ::operator[](&(pLVar11->super_LegacyDataSPKM).mapKeyMetadata,
                         (key_type *)&criticalblock34);
  pmVar12->nCreateTime = lVar19;
  CKey::GetPubKey((CPubKey *)&request,this_00);
  (*(pLVar11->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0x23])
            (pLVar11,this_00,&request);
  AddWallet(&context,&wallet);
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            (val,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x124,"test_method","m_node.chainman");
  criticalblock34.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  criticalblock34.super_unique_lock._8_8_ =
       criticalblock34.super_unique_lock._8_8_ & 0xffffffffffffff00;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock34.super_unique_lock);
  peVar9 = wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pCVar10 = ChainstateManager::ActiveChainstate
                      ((val->_M_t).
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  ppCVar5 = (pCVar10->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppCVar6 = (pCVar10->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pCVar10 = ChainstateManager::ActiveChainstate
                      ((val->_M_t).
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  puVar7 = (pCVar10->m_chain).vChain.
           super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
           super__Vector_impl_data._M_finish[-1]->phashBlock;
  if (puVar7 != (uint256 *)0x0) {
    request.id.super__Optional_base<UniValue,_false,_false>._M_payload.
    super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
    _M_payload._0_8_ = *(undefined8 *)(puVar7->super_base_blob<256U>).m_data._M_elems;
    request.id.super__Optional_base<UniValue,_false,_false>._M_payload.
    super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
    _M_payload._M_value.val._M_dataplus._M_p =
         (_Alloc_hider)*(undefined8 *)((puVar7->super_base_blob<256U>).m_data._M_elems + 8);
    request.id.super__Optional_base<UniValue,_false,_false>._M_payload.
    super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
    _M_payload._M_value.val._M_string_length =
         *(undefined8 *)((puVar7->super_base_blob<256U>).m_data._M_elems + 0x10);
    request.id.super__Optional_base<UniValue,_false,_false>._M_payload.
    super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
    _M_payload._24_8_ = *(undefined8 *)((puVar7->super_base_blob<256U>).m_data._M_elems + 0x18);
    _Var1._M_p = (pointer)((long)&request.id.super__Optional_base<UniValue,_false,_false>._M_payload
                                  .super__Optional_payload<UniValue,_true,_false,_false>.
                                  super__Optional_payload_base<UniValue>._M_payload + 0x18);
    peVar9->m_last_block_processed_height = (int)((ulong)((long)ppCVar5 - (long)ppCVar6) >> 3) + -1;
    *(undefined8 *)(peVar9->m_last_block_processed).super_base_blob<256U>.m_data._M_elems =
         request.id.super__Optional_base<UniValue,_false,_false>._M_payload.
         super__Optional_payload<UniValue,_true,_false,_false>.
         super__Optional_payload_base<UniValue>._M_payload._0_8_;
    *(undefined8 *)((peVar9->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 8) =
         request.id.super__Optional_base<UniValue,_false,_false>._M_payload.
         super__Optional_payload<UniValue,_true,_false,_false>.
         super__Optional_payload_base<UniValue>._M_payload._M_value.val._M_dataplus._M_p;
    *(undefined8 *)((peVar9->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 0x10) =
         request.id.super__Optional_base<UniValue,_false,_false>._M_payload.
         super__Optional_payload<UniValue,_true,_false,_false>.
         super__Optional_payload_base<UniValue>._M_payload._M_value.val._M_string_length;
    *(undefined8 *)((peVar9->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 0x18) =
         request.id.super__Optional_base<UniValue,_false,_false>._M_payload.
         super__Optional_payload<UniValue,_true,_false,_false>.
         super__Optional_payload_base<UniValue>._M_payload._24_8_;
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock34.super_unique_lock);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock2.super_unique_lock);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock1.super_unique_lock);
    request.id.super__Optional_base<UniValue,_false,_false>._M_payload.
    super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
    _M_payload._0_8_ =
         request.id.super__Optional_base<UniValue,_false,_false>._M_payload.
         super__Optional_payload<UniValue,_true,_false,_false>.
         super__Optional_payload_base<UniValue>._M_payload._0_8_ & 0xffffffff00000000;
    request.id.super__Optional_base<UniValue,_false,_false>._M_payload.
    super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
    _M_payload._24_8_ =
         request.id.super__Optional_base<UniValue,_false,_false>._M_payload.
         super__Optional_payload<UniValue,_true,_false,_false>.
         super__Optional_payload_base<UniValue>._M_payload._24_8_ & 0xffffffffffffff00;
    request.id.super__Optional_base<UniValue,_false,_false>._M_payload.
    super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
    _M_payload._M_value.val._M_string_length = 0;
    request.id.super__Optional_base<UniValue,_false,_false>._M_payload.
    super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
    _M_payload._M_value.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    request.id.super__Optional_base<UniValue,_false,_false>._M_payload.
    super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
    _M_payload._M_value.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    request.id.super__Optional_base<UniValue,_false,_false>._M_payload.
    super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
    _M_payload._M_value.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    request.id.super__Optional_base<UniValue,_false,_false>._M_payload.
    super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
    _M_payload._M_value.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    request.id.super__Optional_base<UniValue,_false,_false>._M_payload.
    super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
    _M_payload._M_value.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    request.id.super__Optional_base<UniValue,_false,_false>._M_payload.
    super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
    _M_payload._M_value.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    request.id.super__Optional_base<UniValue,_false,_false>._M_payload.
    super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
    _M_engaged = true;
    request.strMethod._M_dataplus._M_p = (pointer)&request.strMethod.field_2;
    request.strMethod._M_string_length = 0;
    request.strMethod.field_2._M_local_buf[0] = '\0';
    paVar2 = &request.params.val.field_2;
    request.params.val._M_string_length = 0;
    request.params.val.field_2._M_local_buf[0] = '\0';
    request.params.typ = VNULL;
    paVar3 = &request.URI.field_2;
    request.params.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    request.params.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    request.params.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    request.params.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    request.params.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    request.params.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    request.mode = EXECUTE;
    request.URI._M_string_length = 0;
    request.URI.field_2._M_local_buf[0] = '\0';
    request.authUser._M_dataplus._M_p = (pointer)&request.authUser.field_2;
    request.authUser._M_string_length = 0;
    request.authUser.field_2._M_local_buf[0] = '\0';
    request.peerAddr._M_dataplus._M_p = (pointer)&request.peerAddr.field_2;
    request.peerAddr._M_string_length = 0;
    request.peerAddr.field_2._M_local_buf[0] = '\0';
    request.context._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
    request.context._M_storage._M_ptr = (void *)0x0;
    request.m_json_version = V1_LEGACY;
    criticalblock34.super_unique_lock._M_device = (mutex_type *)&context;
    request.id.super__Optional_base<UniValue,_false,_false>._M_payload.
    super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
    _M_payload._M_value.val._M_dataplus._M_p = (_Alloc_hider)_Var1._M_p;
    request.params.val._M_dataplus._M_p = (pointer)paVar2;
    request.URI._M_dataplus._M_p = (pointer)paVar3;
    std::any::operator=(&request.context,(WalletContext **)&criticalblock34);
    ::UniValue::setArray(&request.params);
    ::UniValue::
    UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_2e0,&backup_file);
    val_00.val._M_dataplus._M_p = (pointer)pTVar20;
    val_00._0_8_ = in_stack_fffffffffffff9f8;
    val_00.val._M_string_length = (size_type)this_02;
    val_00.val.field_2._M_allocated_capacity = in_stack_fffffffffffffa10;
    val_00.val.field_2._8_8_ = in_stack_fffffffffffffa18;
    val_00.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffa20;
    val_00.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffa28;
    val_00.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffa30;
    val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffa38;
    val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffa40;
    val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffa48;
    ::UniValue::push_back(&request.params,val_00);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_2e0.values);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2e0.keys);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0.val._M_dataplus._M_p != &local_2e0.val.field_2) {
      operator_delete(local_2e0.val._M_dataplus._M_p,local_2e0.val.field_2._M_allocated_capacity + 1
                     );
    }
    dumpwallet();
    RPCHelpMan::HandleRequest(&local_338,(RPCHelpMan *)&criticalblock34,&request);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_338.values);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_338.keys);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338.val._M_dataplus._M_p != &local_338.val.field_2) {
      operator_delete(local_338.val._M_dataplus._M_p,local_338.val.field_2._M_allocated_capacity + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_p != local_358) {
      operator_delete(local_368._M_p,local_358[0]._M_allocated_capacity + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_380);
    std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_398);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_p != &local_3a8) {
      operator_delete(local_3b8._M_p,local_3a8._M_allocated_capacity + 1);
    }
    if ((__pthread_internal_list *)local_3d8._16_8_ != (__pthread_internal_list *)0x0) {
      (*(code *)local_3d8._16_8_)(local_3d8,local_3d8,3);
    }
    if (criticalblock34.super_unique_lock._M_device != (mutex_type *)local_3e8) {
      operator_delete(criticalblock34.super_unique_lock._M_device,(long)local_3e8[0] + 1);
    }
    RemoveWallet(&context,&wallet,(optional<bool>)0x0);
    JSONRPCRequest::~JSONRPCRequest(&request);
    if (wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    WalletContext::~WalletContext(&context);
    request.id.super__Optional_base<UniValue,_false,_false>._M_payload.
    super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
    _M_payload._0_8_ =
         (pTVar20->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_node.chain.
         _M_t.super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t
         .super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
         super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
    local_428._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_428._M_impl.super__Rb_tree_header._M_header;
    local_428._M_impl._0_8_ = 0;
    local_428._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_428._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_428._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_428._M_impl.super__Rb_tree_header._M_node_count = 0;
    records_00._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = pTVar20;
    records_00._M_t._M_impl._0_8_ = in_stack_fffffffffffff9f8;
    records_00._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)this_02;
    records_00._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)in_stack_fffffffffffffa10;
    records_00._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         (_Base_ptr)in_stack_fffffffffffffa18;
    records_00._M_t._M_impl.super__Rb_tree_header._M_node_count = in_stack_fffffffffffffa20;
    local_428._M_impl.super__Rb_tree_header._M_header._M_right =
         local_428._M_impl.super__Rb_tree_header._M_header._M_left;
    CreateMockableWalletDatabase((wallet *)&criticalblock34,records_00);
    wallet_1.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    __args_2 = &criticalblock34;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<wallet::CWallet,std::allocator<wallet::CWallet>,interfaces::Chain*,char_const(&)[1],std::unique_ptr<wallet::WalletDatabase,std::default_delete<wallet::WalletDatabase>>>
              (&wallet_1.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ,(CWallet **)&wallet_1,(allocator<wallet::CWallet> *)&context,(Chain **)&request,
               (char (*) [1])0xf73bdc,
               (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *)
               __args_2);
    if (criticalblock34.super_unique_lock._M_device != (mutex_type *)0x0) {
      (**(code **)(((criticalblock34.super_unique_lock._M_device)->super___recursive_mutex_base).
                   _M_mutex.__align + 8))();
    }
    criticalblock34.super_unique_lock._M_device = (mutex_type *)0x0;
    std::
    _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
    ::~_Rb_tree(&local_428);
    criticalblock35.super_unique_lock._M_device =
         &((wallet_1.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          cs_wallet).super_recursive_mutex;
    criticalblock35.super_unique_lock._M_owns = false;
    std::unique_lock<std::recursive_mutex>::lock(&criticalblock35.super_unique_lock);
    CWallet::SetupLegacyScriptPubKeyMan
              (wallet_1.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    WalletContext::WalletContext(&context);
    request.id.super__Optional_base<UniValue,_false,_false>._M_payload.
    super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
    _M_payload._0_8_ =
         request.id.super__Optional_base<UniValue,_false,_false>._M_payload.
         super__Optional_payload<UniValue,_true,_false,_false>.
         super__Optional_payload_base<UniValue>._M_payload._0_8_ & 0xffffffff00000000;
    request.id.super__Optional_base<UniValue,_false,_false>._M_payload.
    super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
    _M_payload._24_8_ =
         request.id.super__Optional_base<UniValue,_false,_false>._M_payload.
         super__Optional_payload<UniValue,_true,_false,_false>.
         super__Optional_payload_base<UniValue>._M_payload._24_8_ & 0xffffffffffffff00;
    request.id.super__Optional_base<UniValue,_false,_false>._M_payload.
    super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
    _M_payload._M_value.val._M_string_length = 0;
    request.id.super__Optional_base<UniValue,_false,_false>._M_payload.
    super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
    _M_payload._M_value.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    request.id.super__Optional_base<UniValue,_false,_false>._M_payload.
    super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
    _M_payload._M_value.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    request.id.super__Optional_base<UniValue,_false,_false>._M_payload.
    super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
    _M_payload._M_value.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    request.id.super__Optional_base<UniValue,_false,_false>._M_payload.
    super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
    _M_payload._M_value.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    request.id.super__Optional_base<UniValue,_false,_false>._M_payload.
    super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
    _M_payload._M_value.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    request.id.super__Optional_base<UniValue,_false,_false>._M_payload.
    super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
    _M_payload._M_value.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    request.id.super__Optional_base<UniValue,_false,_false>._M_payload.
    super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
    _M_engaged = true;
    request.strMethod._M_dataplus._M_p = (pointer)&request.strMethod.field_2;
    request.strMethod._M_string_length = 0;
    request.strMethod.field_2._M_local_buf[0] = '\0';
    request.params.val._M_string_length = 0;
    request.params.val.field_2._M_local_buf[0] = '\0';
    request.params.typ = VNULL;
    request.params.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    request.params.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    request.params.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    request.params.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    request.params.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    request.params.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    request.mode = EXECUTE;
    request.URI._M_string_length = 0;
    request.URI.field_2._M_local_buf[0] = '\0';
    request.authUser._M_dataplus._M_p = (pointer)&request.authUser.field_2;
    request.authUser._M_string_length = 0;
    request.authUser.field_2._M_local_buf[0] = '\0';
    request.peerAddr._M_dataplus._M_p = (pointer)&request.peerAddr.field_2;
    request.peerAddr._M_string_length = 0;
    request.peerAddr.field_2._M_local_buf[0] = '\0';
    request.context._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
    request.context._M_storage._M_ptr = (void *)0x0;
    request.m_json_version = V1_LEGACY;
    criticalblock34.super_unique_lock._M_device = (mutex_type *)&context;
    request.id.super__Optional_base<UniValue,_false,_false>._M_payload.
    super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
    _M_payload._M_value.val._M_dataplus._M_p = (_Alloc_hider)_Var1._M_p;
    request.params.val._M_dataplus._M_p = (pointer)paVar2;
    request.URI._M_dataplus._M_p = (pointer)paVar3;
    context.args = this_02;
    std::any::operator=(&request.context,(WalletContext **)&criticalblock34);
    ::UniValue::setArray(&request.params);
    pTVar21 = pTVar20;
    ::UniValue::
    UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_480,&backup_file);
    val_01.val._M_dataplus._M_p = (pointer)pTVar21;
    val_01._0_8_ = in_stack_fffffffffffff9f8;
    val_01.val._M_string_length = (size_type)this_02;
    val_01.val.field_2._M_allocated_capacity = in_stack_fffffffffffffa10;
    val_01.val.field_2._8_8_ = in_stack_fffffffffffffa18;
    val_01.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffa20;
    val_01.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffa28;
    val_01.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffa30;
    val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffa38;
    val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffa40;
    val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffa48;
    ::UniValue::push_back(&request.params,val_01);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_480.values);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_480.keys);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_480.val._M_dataplus._M_p != &local_480.val.field_2) {
      operator_delete(local_480.val._M_dataplus._M_p,local_480.val.field_2._M_allocated_capacity + 1
                     );
    }
    AddWallet(&context,&wallet_1);
    pcVar16 = "m_node.chainman";
    inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
              (val,
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
               ,0x13e,"test_method","m_node.chainman");
    criticalblock36.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
    criticalblock36.super_unique_lock._M_owns = false;
    std::unique_lock<std::recursive_mutex>::lock(&criticalblock36.super_unique_lock);
    peVar9 = wallet_1.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pCVar10 = ChainstateManager::ActiveChainstate
                        ((val->_M_t).
                         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                         .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    ppCVar5 = (pCVar10->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    ppCVar6 = (pCVar10->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    pCVar10 = ChainstateManager::ActiveChainstate
                        ((val->_M_t).
                         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                         .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    puVar7 = (pCVar10->m_chain).vChain.
             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
             super__Vector_impl_data._M_finish[-1]->phashBlock;
    if (puVar7 != (uint256 *)0x0) {
      criticalblock34.super_unique_lock._M_device =
           *(mutex_type **)(puVar7->super_base_blob<256U>).m_data._M_elems;
      pbVar8 = &puVar7->super_base_blob<256U>;
      criticalblock34.super_unique_lock._M_owns = (bool)(pbVar8->m_data)._M_elems[8];
      criticalblock34.super_unique_lock._9_1_ = (pbVar8->m_data)._M_elems[9];
      criticalblock34.super_unique_lock._10_1_ = (pbVar8->m_data)._M_elems[10];
      criticalblock34.super_unique_lock._11_1_ = (pbVar8->m_data)._M_elems[0xb];
      criticalblock34.super_unique_lock._12_1_ = (pbVar8->m_data)._M_elems[0xc];
      criticalblock34.super_unique_lock._13_1_ = (pbVar8->m_data)._M_elems[0xd];
      criticalblock34.super_unique_lock._14_1_ = (pbVar8->m_data)._M_elems[0xe];
      criticalblock34.super_unique_lock._15_1_ = (pbVar8->m_data)._M_elems[0xf];
      local_3e8[0] = *(undefined1 **)((puVar7->super_base_blob<256U>).m_data._M_elems + 0x10);
      local_3e8[1] = *(undefined1 **)((puVar7->super_base_blob<256U>).m_data._M_elems + 0x18);
      peVar9->m_last_block_processed_height =
           (int)((ulong)((long)ppCVar5 - (long)ppCVar6) >> 3) + -1;
      *(mutex_type **)(peVar9->m_last_block_processed).super_base_blob<256U>.m_data._M_elems =
           criticalblock34.super_unique_lock._M_device;
      pbVar8 = &(peVar9->m_last_block_processed).super_base_blob<256U>;
      (pbVar8->m_data)._M_elems[8] = criticalblock34.super_unique_lock._M_owns;
      (pbVar8->m_data)._M_elems[9] = criticalblock34.super_unique_lock._9_1_;
      (pbVar8->m_data)._M_elems[10] = criticalblock34.super_unique_lock._10_1_;
      (pbVar8->m_data)._M_elems[0xb] = criticalblock34.super_unique_lock._11_1_;
      (pbVar8->m_data)._M_elems[0xc] = criticalblock34.super_unique_lock._12_1_;
      (pbVar8->m_data)._M_elems[0xd] = criticalblock34.super_unique_lock._13_1_;
      (pbVar8->m_data)._M_elems[0xe] = criticalblock34.super_unique_lock._14_1_;
      (pbVar8->m_data)._M_elems[0xf] = criticalblock34.super_unique_lock._15_1_;
      *(undefined1 **)
       ((peVar9->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 0x10) =
           local_3e8[0];
      *(undefined1 **)
       ((peVar9->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 0x18) =
           local_3e8[1];
      importwallet();
      RPCHelpMan::HandleRequest(&local_4d8,(RPCHelpMan *)&criticalblock34,&request);
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_4d8.values);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_4d8.keys);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d8.val._M_dataplus._M_p != &local_4d8.val.field_2) {
        operator_delete(local_4d8.val._M_dataplus._M_p,
                        local_4d8.val.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_368._M_p != local_358) {
        operator_delete(local_368._M_p,local_358[0]._M_allocated_capacity + 1);
      }
      std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_380);
      std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_398);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8._M_p != &local_3a8) {
        operator_delete(local_3b8._M_p,local_3a8._M_allocated_capacity + 1);
      }
      if ((__pthread_internal_list *)local_3d8._16_8_ != (__pthread_internal_list *)0x0) {
        (*(code *)local_3d8._16_8_)(local_3d8,local_3d8,3);
      }
      if (criticalblock34.super_unique_lock._M_device != (mutex_type *)local_3e8) {
        operator_delete(criticalblock34.super_unique_lock._M_device,(long)local_3e8[0] + 1);
      }
      RemoveWallet(&context,&wallet_1,(optional<bool>)0x0);
      local_590 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
      ;
      local_588 = "";
      local_5a0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_598 = &boost::unit_test::basic_cstring<char_const>::null;
      file.m_end = (iterator)0x143;
      file.m_begin = (iterator)&local_590;
      msg.m_end = (iterator)__args_2;
      msg.m_begin = pcVar16;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_5a0,msg)
      ;
      criticalblock1.super_unique_lock._M_owns = false;
      criticalblock1.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013ae088;
      _found = ((wallet_1.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               mapWallet)._M_h._M_element_count;
      local_548 = &found;
      criticalblock2.super_unique_lock._M_device =
           (mutex_type *)CONCAT71(criticalblock2.super_unique_lock._M_device._1_7_,_found == 3);
      criticalblock2.super_unique_lock._M_owns = false;
      criticalblock2.super_unique_lock._9_7_ = 0;
      sStack_4e0.pi_ = (sp_counted_base *)0x0;
      local_540 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
      ;
      local_538 = "";
      local_3e8[1] = (undefined1 *)&local_548;
      criticalblock34.super_unique_lock._8_8_ =
           criticalblock34.super_unique_lock._8_8_ & 0xffffffffffffff00;
      criticalblock34.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013ae0c8;
      local_3e8[0] = boost::unit_test::lazy_ostream::inst;
      wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           & 0xffffffffffffff00;
      wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&PTR__lazy_ostream_013ae108;
      pvVar17 = (iterator)0x1;
      pvVar18 = (iterator)0x2;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&criticalblock2,(lazy_ostream *)&criticalblock1,1,2,REQUIRE,
                 0xf8dd1b,(size_t)&local_540,0x143,&criticalblock34,"3U",&wallet);
      boost::detail::shared_count::~shared_count(&sStack_4e0);
      file_00.m_end = (iterator)0x144;
      file_00.m_begin = &stack0xfffffffffffffa40;
      msg_00.m_end = pvVar18;
      msg_00.m_begin = pvVar17;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,
                 (size_t)&stack0xfffffffffffffa30,msg_00);
      criticalblock1.super_unique_lock._M_owns = false;
      criticalblock1.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013ae088;
      lVar19 = (long)(pTVar20->m_coinbase_txns).
                     super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(pTVar20->m_coinbase_txns).
                     super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      _found = lVar19 >> 4;
      criticalblock34.super_unique_lock._8_8_ =
           criticalblock34.super_unique_lock._8_8_ & 0xffffffffffffff00;
      criticalblock34.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013ae0c8;
      wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           & 0xffffffffffffff00;
      criticalblock2.super_unique_lock._M_device =
           (mutex_type *)CONCAT71(criticalblock2.super_unique_lock._M_device._1_7_,lVar19 == 0x670);
      criticalblock2.super_unique_lock._M_owns = false;
      criticalblock2.super_unique_lock._9_7_ = 0;
      sStack_4e0.pi_ = (sp_counted_base *)0x0;
      wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&PTR__lazy_ostream_013ae108;
      local_540 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
      ;
      local_538 = "";
      local_548 = &found;
      local_3e8[0] = boost::unit_test::lazy_ostream::inst;
      local_3e8[1] = (undefined1 *)&local_548;
      pvVar17 = (iterator)0x1;
      pvVar18 = (iterator)0x2;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&criticalblock2,(lazy_ostream *)&criticalblock1,1,2,REQUIRE,
                 0xf8dd34,(size_t)&local_540,0x144,&criticalblock34,"103U",&wallet);
      boost::detail::shared_count::~shared_count(&sStack_4e0);
      psVar13 = (pTVar20->m_coinbase_txns).
                super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((pTVar20->m_coinbase_txns).
          super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != psVar13) {
        lVar19 = 0;
        uVar15 = 0;
        do {
          pCVar14 = CWallet::GetWalletTx
                              (wallet_1.
                               super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr,(uint256 *)
                                      (*(long *)((long)&(psVar13->
                                                                                                                
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  )._M_ptr + lVar19) + 0x39));
          _found = CONCAT71(uStack_5a7,pCVar14 != (CWalletTx *)0x0);
          file_01.m_end = (iterator)0x148;
          file_01.m_begin = &stack0xfffffffffffffa20;
          msg_01.m_end = pvVar18;
          msg_01.m_begin = pvVar17;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,
                     (size_t)&stack0xfffffffffffffa10,msg_01);
          criticalblock1.super_unique_lock._M_owns = false;
          criticalblock1.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013ae088;
          criticalblock2.super_unique_lock._M_device =
               (mutex_type *)
               CONCAT71(criticalblock2.super_unique_lock._M_device._1_7_,found == 99 < uVar15);
          criticalblock2.super_unique_lock._M_owns = false;
          criticalblock2.super_unique_lock._9_7_ = 0;
          sStack_4e0.pi_ = (sp_counted_base *)0x0;
          local_540 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
          ;
          local_538 = "";
          local_548 = &found;
          criticalblock34.super_unique_lock._8_8_ =
               criticalblock34.super_unique_lock._8_8_ & 0xffffffffffffff00;
          criticalblock34.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013ae3e8;
          local_3e8[0] = boost::unit_test::lazy_ostream::inst;
          local_3e8[1] = (undefined1 *)&local_548;
          wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi & 0xffffffffffffff00;
          wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)&PTR__lazy_ostream_013ae3e8;
          pvVar17 = (iterator)0x1;
          pvVar18 = (iterator)0x2;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)&criticalblock2,(lazy_ostream *)&criticalblock1,1,2,REQUIRE
                     ,0xfddd1d,(size_t)&local_540,0x148,&criticalblock34,"expected",&wallet);
          boost::detail::shared_count::~shared_count(&sStack_4e0);
          uVar15 = uVar15 + 1;
          psVar13 = (pTVar21->m_coinbase_txns).
                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar19 = lVar19 + 0x10;
        } while (uVar15 < (ulong)((long)(pTVar21->m_coinbase_txns).
                                        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)psVar13
                                 >> 4));
      }
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock36.super_unique_lock);
      JSONRPCRequest::~JSONRPCRequest(&request);
      WalletContext::~WalletContext(&context);
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock35.super_unique_lock);
      if (wallet_1.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (wallet_1.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)backup_file._M_dataplus._M_p != &backup_file.field_2) {
        operator_delete(backup_file._M_dataplus._M_p,backup_file.field_2._M_allocated_capacity + 1);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar4) {
        __stack_chk_fail();
      }
      return;
    }
  }
  __assert_fail("phashBlock != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h",
                0xf5,"uint256 CBlockIndex::GetBlockHash() const");
}

Assistant:

BOOST_FIXTURE_TEST_CASE(importwallet_rescan, TestChain100Setup)
{
    // Create two blocks with same timestamp to verify that importwallet rescan
    // will pick up both blocks, not just the first.
    const int64_t BLOCK_TIME = WITH_LOCK(Assert(m_node.chainman)->GetMutex(), return m_node.chainman->ActiveChain().Tip()->GetBlockTimeMax() + 5);
    SetMockTime(BLOCK_TIME);
    m_coinbase_txns.emplace_back(CreateAndProcessBlock({}, GetScriptForRawPubKey(coinbaseKey.GetPubKey())).vtx[0]);
    m_coinbase_txns.emplace_back(CreateAndProcessBlock({}, GetScriptForRawPubKey(coinbaseKey.GetPubKey())).vtx[0]);

    // Set key birthday to block time increased by the timestamp window, so
    // rescan will start at the block time.
    const int64_t KEY_TIME = BLOCK_TIME + TIMESTAMP_WINDOW;
    SetMockTime(KEY_TIME);
    m_coinbase_txns.emplace_back(CreateAndProcessBlock({}, GetScriptForRawPubKey(coinbaseKey.GetPubKey())).vtx[0]);

    std::string backup_file = fs::PathToString(m_args.GetDataDirNet() / "wallet.backup");

    // Import key into wallet and call dumpwallet to create backup file.
    {
        WalletContext context;
        context.args = &m_args;
        const std::shared_ptr<CWallet> wallet = std::make_shared<CWallet>(m_node.chain.get(), "", CreateMockableWalletDatabase());
        {
            auto spk_man = wallet->GetOrCreateLegacyScriptPubKeyMan();
            LOCK2(wallet->cs_wallet, spk_man->cs_KeyStore);
            spk_man->mapKeyMetadata[coinbaseKey.GetPubKey().GetID()].nCreateTime = KEY_TIME;
            spk_man->AddKeyPubKey(coinbaseKey, coinbaseKey.GetPubKey());

            AddWallet(context, wallet);
            LOCK(Assert(m_node.chainman)->GetMutex());
            wallet->SetLastBlockProcessed(m_node.chainman->ActiveChain().Height(), m_node.chainman->ActiveChain().Tip()->GetBlockHash());
        }
        JSONRPCRequest request;
        request.context = &context;
        request.params.setArray();
        request.params.push_back(backup_file);

        wallet::dumpwallet().HandleRequest(request);
        RemoveWallet(context, wallet, /* load_on_start= */ std::nullopt);
    }

    // Call importwallet RPC and verify all blocks with timestamps >= BLOCK_TIME
    // were scanned, and no prior blocks were scanned.
    {
        const std::shared_ptr<CWallet> wallet = std::make_shared<CWallet>(m_node.chain.get(), "", CreateMockableWalletDatabase());
        LOCK(wallet->cs_wallet);
        wallet->SetupLegacyScriptPubKeyMan();

        WalletContext context;
        context.args = &m_args;
        JSONRPCRequest request;
        request.context = &context;
        request.params.setArray();
        request.params.push_back(backup_file);
        AddWallet(context, wallet);
        LOCK(Assert(m_node.chainman)->GetMutex());
        wallet->SetLastBlockProcessed(m_node.chainman->ActiveChain().Height(), m_node.chainman->ActiveChain().Tip()->GetBlockHash());
        wallet::importwallet().HandleRequest(request);
        RemoveWallet(context, wallet, /* load_on_start= */ std::nullopt);

        BOOST_CHECK_EQUAL(wallet->mapWallet.size(), 3U);
        BOOST_CHECK_EQUAL(m_coinbase_txns.size(), 103U);
        for (size_t i = 0; i < m_coinbase_txns.size(); ++i) {
            bool found = wallet->GetWalletTx(m_coinbase_txns[i]->GetHash());
            bool expected = i >= 100;
            BOOST_CHECK_EQUAL(found, expected);
        }
    }
}